

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * file_makename(lemon *lemp,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  
  pcVar3 = lemp->outbasefilename;
  sVar1 = strlen(pcVar3);
  sVar2 = strlen(suffix);
  __dest = (char *)malloc((long)((int)sVar2 + (int)sVar1 + 5));
  if (__dest != (char *)0x0) {
    strcpy(__dest,pcVar3);
    pcVar3 = strrchr(__dest,0x2e);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    pcVar3 = strcat(__dest,suffix);
    return pcVar3;
  }
  fwrite("Can\'t allocate space for a filename.\n",0x25,1,_stderr);
  exit(1);
}

Assistant:

PRIVATE char *file_makename(struct lemon *lemp, const char *suffix)
{
  char *name;
  char *cp;

  name = (char*)malloc( lemonStrlen(lemp->outbasefilename) + lemonStrlen(suffix) + 5 );
  if( name==0 ){
    fprintf(stderr,"Can't allocate space for a filename.\n");
    exit(1);
  }
  strcpy(name,lemp->outbasefilename);
  cp = strrchr(name,'.');
  if( cp ) *cp = 0;
  strcat(name,suffix);
  return name;
}